

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

void __thiscall
Js::CompoundString::Block::Block
          (Block *this,void *buffer,CharCount charLength,CharCount charCapacity)

{
  Block *pBVar1;
  code *pcVar2;
  bool bVar3;
  CharCount CVar4;
  undefined4 *puVar5;
  
  Memory::Recycler::WBSetBit((char *)this);
  (this->bufferOwner).ptr = this;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  this->charLength = charLength;
  this->charCapacity = charCapacity;
  (this->previous).ptr = (Block *)0x0;
  if (buffer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x25,"(buffer)","buffer");
    if (!bVar3) goto LAB_00b369bd;
    *puVar5 = 0;
  }
  if (charCapacity < charLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x26,"(charLength <= charCapacity)","charLength <= charCapacity");
    if (!bVar3) {
LAB_00b369bd:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pBVar1 = (this->bufferOwner).ptr;
  CVar4 = PointerLengthFromCharLength(charLength);
  Memory::Recycler::WBSetBitRange((char *)(pBVar1 + 1),CVar4);
  js_wmemcpy_s((char16 *)((this->bufferOwner).ptr + 1),(ulong)charLength,(char16 *)buffer,
               (ulong)charLength);
  pBVar1 = (this->bufferOwner).ptr;
  CVar4 = PointerLengthFromCharLength(charLength);
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pBVar1 + 1,(ulong)CVar4 << 3);
  return;
}

Assistant:

CompoundString::Block::Block(
        const void *const buffer,
        const CharCount charLength,
        const CharCount charCapacity)
        : bufferOwner(this), charLength(charLength), charCapacity(charCapacity), previous(nullptr)
    {
        Assert(buffer);
        Assert(charLength <= charCapacity);

        ArrayWriteBarrierVerifyBits(Block::Pointers(Chars()), Block::PointerLengthFromCharLength(charLength));
        js_wmemcpy_s(Chars(), charLength, Chars(buffer), charLength);
        // SWB: buffer may contain chars or pointers. Trigger write barrier for the whole buffer.
        ArrayWriteBarrier(Pointers(), PointerLengthFromCharLength(charLength));
    }